

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O3

GenericDatum __thiscall avro::makeGenericDatum(avro *this,NodePtr *n,Entity *e,SymbolTable *st)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  element_type *peVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
  *this_00;
  placeholder *ppVar3;
  undefined1 *puVar4;
  _Alloc_hider _Var5;
  GenericDatum *this_01;
  pointer pGVar6;
  int iVar7;
  placeholder *tmp;
  undefined4 extraout_var;
  const_iterator cVar8;
  undefined8 extraout_RAX;
  undefined4 extraout_var_00;
  _Base_ptr p_Var9;
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>_>
  *psVar10;
  long *plVar11;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  double *pdVar12;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *psVar13;
  undefined8 *extraout_RAX_02;
  undefined8 *extraout_RAX_03;
  bool *pbVar14;
  undefined8 *puVar15;
  shared_ptr<std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>_> *psVar16;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  const_iterator cVar17;
  undefined4 extraout_var_04;
  undefined8 uVar18;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  Name *this_02;
  undefined8 *extraout_RAX_04;
  Type extraout_var_09;
  Exception *pEVar19;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  placeholder *extraout_RDX_00;
  placeholder *extraout_RDX_01;
  placeholder *extraout_RDX_02;
  placeholder *extraout_RDX_03;
  placeholder *extraout_RDX_04;
  placeholder *extraout_RDX_05;
  placeholder *extraout_RDX_06;
  placeholder *extraout_RDX_07;
  placeholder *extraout_RDX_08;
  placeholder *extraout_RDX_09;
  any aVar21;
  pointer e_00;
  long lVar22;
  ulong uVar23;
  _Rb_tree_header *p_Var24;
  bool bVar25;
  GenericDatum GVar26;
  GenericDatum GVar27;
  GenericMap result;
  Type t;
  string name;
  Entity e2;
  Type t_1;
  GenericArray result_2;
  string local_208;
  _Rb_tree<avro::Name,_std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>,_std::_Select1st<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
  *local_1e8;
  GenericDatum *local_1e0;
  undefined1 local_1d8 [16];
  vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> local_1c8;
  undefined1 local_1ac [4];
  put_holder<char,_std::char_traits<char>_> local_1a8;
  Entity local_188;
  undefined4 local_174;
  NodePtr local_170;
  NodePtr local_160;
  undefined1 local_150 [16];
  vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> local_140;
  any local_128;
  Entity *local_70;
  NodePtr local_68;
  NodePtr local_58;
  put_holder<char,_std::char_traits<char>_> local_48;
  undefined4 extraout_var_05;
  any extraout_RDX;
  
  local_1ac = (undefined1  [4])n->px->type_;
  local_1e8 = &st->_M_t;
  if (local_1ac == (undefined1  [4])0xe) {
    iVar7 = (*n->px->_vptr_Node[3])();
    cVar8 = std::
            _Rb_tree<avro::Name,_std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>,_std::_Select1st<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
            ::find(local_1e8,(key_type *)CONCAT44(extraout_var,iVar7));
    boost::shared_ptr<avro::Node>::operator=(n,(shared_ptr<avro::Node> *)(cVar8._M_node + 3));
    local_1ac = (undefined1  [4])n->px->type_;
  }
  switch(local_1ac) {
  case (undefined1  [4])0x0:
    assertType(e,etString);
    json::Entity::ensureType(e,etString);
    psVar13 = boost::any_cast<boost::shared_ptr<std::__cxx11::string>>(&e->value_);
    value = psVar13->px;
    *(undefined4 *)this = 0;
    boost::any::any<std::__cxx11::string>((any *)(this + 8),value);
    GVar26.value_.content = extraout_RDX.content;
    GVar26._0_8_ = extraout_RAX;
    return GVar26;
  case (undefined1  [4])0x1:
    assertType(e,etString);
    json::Entity::ensureType(e,etString);
    psVar13 = boost::any_cast<boost::shared_ptr<std::__cxx11::string>>(&e->value_);
    toBin((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_150,psVar13->px);
    *(undefined4 *)this = 1;
    boost::any::any<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((any *)(this + 8),(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_150)
    ;
    puVar15 = extraout_RAX_01;
    aVar21.content = extraout_RDX_04;
    local_1d8._0_8_ = local_150._0_8_;
    local_1c8.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_140.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>.
         _M_impl.super__Vector_impl_data._M_start;
    goto joined_r0x001550f9;
  case (undefined1  [4])0x2:
    assertType(e,etLong);
    json::Entity::ensureType(e,etLong);
    plVar11 = boost::any_cast<long_const&>(&e->value_);
    lVar22 = *plVar11;
    *(undefined4 *)this = 2;
    puVar15 = (undefined8 *)operator_new(0x10);
    *puVar15 = &PTR__placeholder_001914b8;
    *(int *)(puVar15 + 1) = (int)lVar22;
    aVar21.content = extraout_RDX_01;
    break;
  case (undefined1  [4])0x3:
    assertType(e,etLong);
    json::Entity::ensureType(e,etLong);
    plVar11 = boost::any_cast<long_const&>(&e->value_);
    lVar22 = *plVar11;
    *(undefined4 *)this = 3;
    puVar15 = (undefined8 *)operator_new(0x10);
    *puVar15 = &PTR__placeholder_00191500;
    puVar15[1] = lVar22;
    aVar21.content = extraout_RDX_02;
    break;
  case (undefined1  [4])0x4:
    assertType(e,etDouble);
    json::Entity::ensureType(e,etDouble);
    pdVar12 = boost::any_cast<double_const&>(&e->value_);
    local_1e8 = (_Rb_tree<avro::Name,_std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>,_std::_Select1st<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
                 *)CONCAT44(local_1e8._4_4_,(float)*pdVar12);
    *(undefined4 *)this = 4;
    puVar15 = (undefined8 *)operator_new(0x10);
    *puVar15 = &PTR__placeholder_00191548;
    *(undefined4 *)(puVar15 + 1) = local_1e8._0_4_;
    aVar21.content = extraout_RDX_00;
    break;
  case (undefined1  [4])0x5:
    assertType(e,etDouble);
    json::Entity::ensureType(e,etDouble);
    pdVar12 = boost::any_cast<double_const&>(&e->value_);
    local_1e8 = (_Rb_tree<avro::Name,_std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>,_std::_Select1st<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
                 *)*pdVar12;
    *(undefined4 *)this = 5;
    puVar15 = (undefined8 *)operator_new(0x10);
    *puVar15 = &PTR__placeholder_00191590;
    puVar15[1] = local_1e8;
    aVar21.content = extraout_RDX_05;
    break;
  case (undefined1  [4])0x6:
    assertType(e,etBool);
    json::Entity::ensureType(e,etBool);
    pbVar14 = boost::any_cast<bool_const&>(&e->value_);
    bVar25 = *pbVar14;
    *(undefined4 *)this = 6;
    puVar15 = (undefined8 *)operator_new(0x10);
    *puVar15 = &PTR__placeholder_001915d8;
    *(bool *)(puVar15 + 1) = bVar25;
    aVar21.content = extraout_RDX_08;
    break;
  case (undefined1  [4])0x7:
    assertType(e,etNull);
    *(undefined4 *)this = 7;
    *(undefined8 *)(this + 8) = 0;
    puVar15 = extraout_RAX_00;
    aVar21.content = extraout_RDX_03;
    goto LAB_001556fe;
  case (undefined1  [4])0x8:
    local_1e0 = (GenericDatum *)this;
    assertType(e,etObject);
    GenericRecord::GenericRecord((GenericRecord *)local_1d8,n);
    json::Entity::ensureType(e,etObject);
    psVar10 = boost::
              any_cast<boost::shared_ptr<std::map<std::__cxx11::string,avro::json::Entity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,avro::json::Entity>>>>>
                        (&e->value_);
    this_00 = &psVar10->px->_M_t;
    lVar22 = 8;
    for (uVar23 = 0; iVar7 = (*n->px->_vptr_Node[4])(), uVar23 < CONCAT44(extraout_var_02,iVar7);
        uVar23 = uVar23 + 1) {
      iVar7 = (*n->px->_vptr_Node[8])(n->px,uVar23 & 0xffffffff);
      cVar17 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
               ::find(this_00,(key_type *)CONCAT44(extraout_var_03,iVar7));
      if ((_Rb_tree_header *)cVar17._M_node == &(this_00->_M_impl).super__Rb_tree_header) {
        pEVar19 = (Exception *)__cxa_allocate_exception(0x18);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                   "No value found in default for %1%");
        iVar7 = (*n->px->_vptr_Node[8])(n->px,uVar23 & 0xffffffff);
        local_1a8.arg = (void *)CONCAT44(extraout_var_09,iVar7);
        local_1a8.put_head =
             boost::io::detail::
             call_put_head<char,std::char_traits<char>,std::__cxx11::string_const>;
        local_1a8.put_last =
             boost::io::detail::
             call_put_last<char,std::char_traits<char>,std::__cxx11::string_const>;
        pbVar20 = boost::io::detail::
                  feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_150,(put_holder<char,_std::char_traits<char>_> *)(local_1ac + 4))
        ;
        Exception::Exception(pEVar19,pbVar20);
        __cxa_throw(pEVar19,&Exception::typeinfo,Exception::~Exception);
      }
      iVar7 = (*n->px->_vptr_Node[5])(n->px,uVar23 & 0xffffffff);
      local_160.px = *(element_type **)CONCAT44(extraout_var_04,iVar7);
      local_160.pn.pi_ = (sp_counted_base *)((undefined8 *)CONCAT44(extraout_var_04,iVar7))[1];
      if (local_160.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_160.pn.pi_)->use_count_ = (local_160.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      makeGenericDatum((avro *)local_150,&local_160,(Entity *)(cVar17._M_node + 2),
                       (SymbolTable *)local_1e8);
      pGVar6 = local_1c8.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)
       ((long)local_1c8.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar22 + -8) = local_150._0_4_;
      if ((pointer)local_150._8_8_ == (pointer)0x0) {
        uVar18 = 0;
      }
      else {
        iVar7 = (**(code **)((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_150._8_8_)->_M_dataplus)._M_p + 0x18))();
        uVar18 = CONCAT44(extraout_var_05,iVar7);
      }
      plVar11 = *(long **)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&pGVar6->type_)->_M_dataplus)._M_p + lVar22);
      *(undefined8 *)
       ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pGVar6->type_
                )->_M_dataplus)._M_p + lVar22) = uVar18;
      if (plVar11 != (long *)0x0) {
        (**(code **)(*plVar11 + 8))();
      }
      if ((pointer)local_150._8_8_ != (pointer)0x0) {
        (**(code **)((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_150._8_8_)->_M_dataplus)._M_p + 8))();
      }
      boost::detail::shared_count::~shared_count(&local_160.pn);
      lVar22 = lVar22 + 0x10;
    }
    GenericDatum::GenericDatum<avro::GenericRecord>(local_1e0,n,(GenericRecord *)local_1d8);
    std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::~vector(&local_1c8);
    goto LAB_001556f4;
  case (undefined1  [4])0x9:
    assertType(e,etString);
    json::Entity::ensureType(e,etString);
    psVar13 = boost::any_cast<boost::shared_ptr<std::__cxx11::string>>(&e->value_);
    GenericEnum::GenericEnum((GenericEnum *)local_150,n,psVar13->px);
    GenericDatum::GenericDatum<avro::GenericEnum>((GenericDatum *)this,n,(GenericEnum *)local_150);
    goto LAB_00155271;
  case (undefined1  [4])0xa:
    local_1e0 = (GenericDatum *)this;
    assertType(e,etArray);
    GenericContainer::GenericContainer((GenericContainer *)local_150,AVRO_ARRAY,n);
    local_140.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_140.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_140.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    json::Entity::ensureType(e,etArray);
    psVar16 = boost::
              any_cast<boost::shared_ptr<std::vector<avro::json::Entity,std::allocator<avro::json::Entity>>>>
                        (&e->value_);
    peVar2 = psVar16->px;
    e_00 = (peVar2->super__Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_>).
           _M_impl.super__Vector_impl_data._M_start;
    if (e_00 != (peVar2->super__Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        iVar7 = (*n->px->_vptr_Node[5])(n->px,0);
        local_58.px = *(element_type **)CONCAT44(extraout_var_01,iVar7);
        local_58.pn.pi_ = (sp_counted_base *)((undefined8 *)CONCAT44(extraout_var_01,iVar7))[1];
        if (local_58.pn.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_58.pn.pi_)->use_count_ = (local_58.pn.pi_)->use_count_ + 1;
          UNLOCK();
        }
        makeGenericDatum((avro *)local_1d8,&local_58,e_00,(SymbolTable *)local_1e8);
        std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::
        emplace_back<avro::GenericDatum>(&local_140,(GenericDatum *)local_1d8);
        if ((sp_counted_base *)local_1d8._8_8_ != (sp_counted_base *)0x0) {
          (*(*(_func_int ***)local_1d8._8_8_)[1])();
        }
        boost::detail::shared_count::~shared_count(&local_58.pn);
        e_00 = e_00 + 1;
      } while (e_00 != (peVar2->
                       super__Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_>).
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    GenericDatum::GenericDatum<avro::GenericArray>(local_1e0,n,(GenericArray *)local_150);
    std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::~vector(&local_140);
LAB_00155271:
    puVar4 = local_150;
    goto LAB_001556f9;
  case (undefined1  [4])0xb:
    local_1e0 = (GenericDatum *)this;
    assertType(e,etObject);
    GenericContainer::GenericContainer((GenericContainer *)local_1d8,AVRO_MAP,n);
    local_1c8.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    json::Entity::ensureType(e,etObject);
    psVar10 = boost::
              any_cast<boost::shared_ptr<std::map<std::__cxx11::string,avro::json::Entity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,avro::json::Entity>>>>>
                        (&e->value_);
    p_Var9 = (psVar10->px->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var24 = &(psVar10->px->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 != p_Var24) {
      do {
        iVar7 = (*n->px->_vptr_Node[5])(n->px,1);
        local_170.px = *(element_type **)CONCAT44(extraout_var_00,iVar7);
        local_170.pn.pi_ = (sp_counted_base *)((undefined8 *)CONCAT44(extraout_var_00,iVar7))[1];
        if (local_170.pn.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_170.pn.pi_)->use_count_ = (local_170.pn.pi_)->use_count_ + 1;
          UNLOCK();
        }
        makeGenericDatum((avro *)(local_1ac + 4),&local_170,(Entity *)(p_Var9 + 2),
                         (SymbolTable *)local_1e8);
        local_150._0_8_ = (element_type *)&local_140;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_150,*(long *)(p_Var9 + 1),
                   (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
        local_140.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT44(local_140.
                               super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                               local_1a8.arg._0_4_);
        local_128.content = (placeholder *)local_1a8.put_head;
        local_1a8.put_head =
             (_func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_void_ptr *)0x0;
        std::
        vector<std::pair<std::__cxx11::string,avro::GenericDatum>,std::allocator<std::pair<std::__cxx11::string,avro::GenericDatum>>>
        ::emplace_back<std::pair<std::__cxx11::string,avro::GenericDatum>>
                  ((vector<std::pair<std::__cxx11::string,avro::GenericDatum>,std::allocator<std::pair<std::__cxx11::string,avro::GenericDatum>>>
                    *)&local_1c8,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>
                    *)local_150);
        if (local_128.content != (placeholder *)0x0) {
          (*(local_128.content)->_vptr_placeholder[1])();
        }
        if ((element_type *)local_150._0_8_ != (element_type *)&local_140) {
          operator_delete((void *)local_150._0_8_,
                          (long)local_140.
                                super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1);
        }
        if ((placeholder *)local_1a8.put_head != (placeholder *)0x0) {
          (*(*(_func_int ***)local_1a8.put_head)[1])();
        }
        boost::detail::shared_count::~shared_count(&local_170.pn);
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var24);
    }
    GenericDatum::GenericDatum<avro::GenericMap>(local_1e0,n,(GenericMap *)local_1d8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
               *)&local_1c8);
LAB_001556f4:
    puVar4 = local_1d8;
LAB_001556f9:
    boost::detail::shared_count::~shared_count((shared_count *)(puVar4 + 8));
    puVar15 = extraout_RAX_04;
    aVar21.content = extraout_RDX_09;
    goto LAB_001556fe;
  case (undefined1  [4])0xc:
    GenericUnion::GenericUnion((GenericUnion *)local_1d8,n);
    local_1a8.arg = &local_1a8.put_last;
    local_1a8.put_head = (_func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_void_ptr *)0x0
    ;
    local_1a8.put_last =
         (_func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_void_ptr *)
         ((ulong)local_1a8.put_last & 0xffffffffffffff00);
    local_188.type_ = etNull;
    local_188.value_.content = (placeholder *)0x0;
    local_70 = e;
    if (e->type_ == etNull) {
      local_1e0 = (GenericDatum *)this;
      std::__cxx11::string::_M_replace((ulong)(local_1ac + 4),0,(char *)0x0,0x1760a4);
      local_188.type_ = e->type_;
      ppVar3 = (e->value_).content;
      if (ppVar3 != (placeholder *)0x0) {
        iVar7 = (*ppVar3->_vptr_placeholder[3])();
        local_188.value_.content = (placeholder *)CONCAT44(extraout_var_06,iVar7);
        goto LAB_0015540a;
      }
    }
    else {
      local_1e0 = (GenericDatum *)this;
      assertType(e,etObject);
      json::Entity::ensureType(e,etObject);
      psVar10 = boost::
                any_cast<boost::shared_ptr<std::map<std::__cxx11::string,avro::json::Entity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,avro::json::Entity>>>>>
                          (&e->value_);
      if ((psVar10->px->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 1) {
        pEVar19 = (Exception *)__cxa_allocate_exception(0x18);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                   "Default value for union has more than one field: %1%");
        json::Entity::toString_abi_cxx11_(&local_208,e);
        local_48.put_head =
             boost::io::detail::
             call_put_head<char,std::char_traits<char>,std::__cxx11::string_const>;
        local_48.put_last =
             boost::io::detail::
             call_put_last<char,std::char_traits<char>,std::__cxx11::string_const>;
        local_48.arg = &local_208;
        pbVar20 = boost::io::detail::
                  feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_150,&local_48);
        Exception::Exception(pEVar19,pbVar20);
        __cxa_throw(pEVar19,&Exception::typeinfo,Exception::~Exception);
      }
      p_Var9 = (psVar10->px->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::_M_assign((string *)(local_1ac + 4));
      local_188.type_ = p_Var9[2]._M_color;
      p_Var9 = p_Var9[2]._M_parent;
      if (p_Var9 != (_Base_ptr)0x0) {
        local_188.value_.content = (placeholder *)(**(code **)(*(long *)p_Var9 + 0x18))();
        goto LAB_0015540a;
      }
    }
    local_188.value_.content = (placeholder *)0x0;
LAB_0015540a:
    paVar1 = &local_208.field_2;
    uVar23 = 0;
    do {
      iVar7 = (*n->px->_vptr_Node[4])();
      if (CONCAT44(extraout_var_07,iVar7) <= uVar23) {
        pEVar19 = (Exception *)__cxa_allocate_exception(0x18);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                   "Invalid default value %1%");
        json::Entity::toString_abi_cxx11_(&local_208,local_70);
        local_48.put_head =
             boost::io::detail::
             call_put_head<char,std::char_traits<char>,std::__cxx11::string_const>;
        local_48.put_last =
             boost::io::detail::
             call_put_last<char,std::char_traits<char>,std::__cxx11::string_const>;
        local_48.arg = &local_208;
        pbVar20 = boost::io::detail::
                  feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_150,&local_48);
        Exception::Exception(pEVar19,pbVar20);
        __cxa_throw(pEVar19,&Exception::typeinfo,Exception::~Exception);
      }
      iVar7 = (*n->px->_vptr_Node[5])(n->px,uVar23 & 0xffffffff);
      plVar11 = (long *)CONCAT44(extraout_var_08,iVar7);
      local_174 = (undefined4)((long *)*plVar11)[1];
      switch(local_174) {
      case 0:
        local_208.field_2._M_local_buf[4] = 'n';
        local_208.field_2._M_local_buf[5] = 'g';
        local_208.field_2._M_allocated_capacity._0_2_ = 0x7473;
        local_208.field_2._M_local_buf[2] = 'r';
        local_208.field_2._M_local_buf[3] = 'i';
        goto LAB_00155547;
      case 1:
        local_208.field_2._M_local_buf[4] = 's';
        local_208.field_2._M_allocated_capacity._0_2_ = 0x7962;
        local_208.field_2._M_local_buf[2] = 't';
        local_208.field_2._M_local_buf[3] = 'e';
        goto LAB_00155520;
      case 2:
        local_208.field_2._M_local_buf[2] = 't';
        local_208.field_2._M_allocated_capacity._0_2_ = 0x6e69;
        goto LAB_00155593;
      case 3:
        local_208.field_2._M_allocated_capacity._0_2_ = 0x6f6c;
        local_208.field_2._M_local_buf[2] = 'n';
        local_208.field_2._M_local_buf[3] = 'g';
        goto LAB_001554d2;
      case 4:
        local_208.field_2._M_local_buf[4] = 't';
        local_208.field_2._M_allocated_capacity._0_2_ = 0x6c66;
        local_208.field_2._M_local_buf[2] = 'o';
        local_208.field_2._M_local_buf[3] = 'a';
        goto LAB_00155520;
      case 5:
        local_208.field_2._M_local_buf[4] = 'l';
        local_208.field_2._M_local_buf[5] = 'e';
        local_208.field_2._M_allocated_capacity._0_2_ = 0x6f64;
        local_208.field_2._M_local_buf[2] = 'u';
        local_208.field_2._M_local_buf[3] = 'b';
LAB_00155547:
        local_208._M_string_length = 6;
        local_208.field_2._M_local_buf[6] = '\0';
        local_208._M_dataplus._M_p = (pointer)paVar1;
        break;
      case 6:
        local_208.field_2._M_local_buf[4] = 'e';
        local_208.field_2._M_local_buf[5] = 'a';
        local_208.field_2._M_local_buf[6] = 'n';
        local_208.field_2._M_allocated_capacity._0_2_ = 0x6f62;
        local_208.field_2._M_local_buf[2] = 'o';
        local_208.field_2._M_local_buf[3] = 'l';
        local_208._M_string_length = 7;
        local_208.field_2._M_local_buf[7] = '\0';
        local_208._M_dataplus._M_p = (pointer)paVar1;
        break;
      case 7:
        local_208.field_2._M_allocated_capacity._0_2_ = 0x756e;
        local_208.field_2._M_local_buf[2] = 'l';
        local_208.field_2._M_local_buf[3] = 'l';
LAB_001554d2:
        local_208._M_string_length = 4;
        local_208.field_2._M_local_buf[4] = '\0';
        local_208._M_dataplus._M_p = (pointer)paVar1;
        break;
      case 8:
      case 9:
      case 0xd:
      case 0xe:
        this_02 = (Name *)(**(code **)(*(long *)*plVar11 + 0x18))();
        Name::fullname_abi_cxx11_(&local_208,this_02);
        break;
      case 10:
        local_208.field_2._M_local_buf[4] = 'y';
        local_208.field_2._M_allocated_capacity._0_2_ = 0x7261;
        local_208.field_2._M_local_buf[2] = 'r';
        local_208.field_2._M_local_buf[3] = 'a';
        goto LAB_00155520;
      case 0xb:
        local_208.field_2._M_local_buf[2] = 'p';
        local_208.field_2._M_allocated_capacity._0_2_ = 0x616d;
LAB_00155593:
        local_208._M_string_length = 3;
        local_208.field_2._M_local_buf[3] = '\0';
        local_208._M_dataplus._M_p = (pointer)paVar1;
        break;
      case 0xc:
        local_208.field_2._M_local_buf[4] = 'n';
        local_208.field_2._M_allocated_capacity._0_2_ = 0x6e75;
        local_208.field_2._M_local_buf[2] = 'i';
        local_208.field_2._M_local_buf[3] = 'o';
LAB_00155520:
        local_208._M_string_length = 5;
        local_208.field_2._M_local_buf[5] = '\0';
        local_208._M_dataplus._M_p = (pointer)paVar1;
        break;
      default:
        pEVar19 = (Exception *)__cxa_allocate_exception(0x18);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                   "Unknown type: %1%");
        local_48.arg = &local_174;
        local_48.put_head = boost::io::detail::call_put_head<char,std::char_traits<char>,avro::Type>
        ;
        local_48.put_last = boost::io::detail::call_put_last<char,std::char_traits<char>,avro::Type>
        ;
        pbVar20 = boost::io::detail::
                  feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_150,&local_48);
        Exception::Exception(pEVar19,pbVar20);
        __cxa_throw(pEVar19,&Exception::typeinfo,Exception::~Exception);
      }
      _Var5._M_p = local_208._M_dataplus._M_p;
      if ((_func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_void_ptr *)
          local_208._M_string_length == local_1a8.put_head) {
        if ((placeholder *)local_208._M_string_length == (placeholder *)0x0) {
          bVar25 = true;
        }
        else {
          iVar7 = bcmp(local_208._M_dataplus._M_p,local_1a8.arg,local_208._M_string_length);
          bVar25 = iVar7 == 0;
        }
      }
      else {
        bVar25 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var5._M_p != paVar1) {
        operator_delete(_Var5._M_p,
                        CONCAT17(local_208.field_2._M_local_buf[7],
                                 CONCAT16(local_208.field_2._M_local_buf[6],
                                          CONCAT15(local_208.field_2._M_local_buf[5],
                                                   CONCAT14(local_208.field_2._M_local_buf[4],
                                                            CONCAT13(local_208.field_2._M_local_buf
                                                                     [3],CONCAT12(local_208.field_2.
                                                                                  _M_local_buf[2],
                                                                                  local_208.field_2.
                                                                                                                                                                    
                                                  _M_allocated_capacity._0_2_)))))) + 1);
      }
      if (bVar25) {
        GenericUnion::selectBranch((GenericUnion *)local_1d8,uVar23);
        this_01 = local_1e0;
        local_68.px = (element_type *)*plVar11;
        local_68.pn.pi_ = (sp_counted_base *)plVar11[1];
        if (local_68.pn.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_68.pn.pi_)->use_count_ = (local_68.pn.pi_)->use_count_ + 1;
          UNLOCK();
        }
        makeGenericDatum((avro *)local_150,&local_68,&local_188,(SymbolTable *)local_1e8);
        pGVar6 = local_1c8.
                 super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
        local_1c8.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(local_1c8.
                               super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>
                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,local_150._0_4_);
        local_1c8.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_150._8_8_;
        local_150._8_8_ = (pointer)0x0;
        if (((pointer)pGVar6 != (pointer)0x0) &&
           ((**(code **)((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &pGVar6->type_)->_M_dataplus)._M_p + 8))(),
           (pointer)local_150._8_8_ != (pointer)0x0)) {
          (**(code **)((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_150._8_8_)->_M_dataplus)._M_p + 8))();
        }
        boost::detail::shared_count::~shared_count(&local_68.pn);
        GenericDatum::GenericDatum<avro::GenericUnion>(this_01,n,(GenericUnion *)local_1d8);
        if (local_188.value_.content != (placeholder *)0x0) {
          (*(local_188.value_.content)->_vptr_placeholder[1])();
        }
        if ((_func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_void_ptr **)local_1a8.arg
            != &local_1a8.put_last) {
          operator_delete(local_1a8.arg,(ulong)(local_1a8.put_last + 1));
        }
        if ((pointer)local_1c8.
                     super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          (**(code **)((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &(local_1c8.
                          super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->type_)->_M_dataplus).
                       _M_p + 8))();
        }
        goto LAB_001556f4;
      }
      uVar23 = uVar23 + 1;
    } while( true );
  case (undefined1  [4])0xd:
    assertType(e,etString);
    json::Entity::ensureType(e,etString);
    psVar13 = boost::any_cast<boost::shared_ptr<std::__cxx11::string>>(&e->value_);
    toBin((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8,psVar13->px);
    GenericFixed::GenericFixed
              ((GenericFixed *)local_150,n,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8);
    GenericDatum::GenericDatum<avro::GenericFixed>((GenericDatum *)this,n,(GenericFixed *)local_150)
    ;
    if (local_140.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_140.
                      super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_140.
                            super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_140.
                            super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    boost::detail::shared_count::~shared_count((shared_count *)(local_150 + 8));
    puVar15 = extraout_RAX_02;
    aVar21.content = extraout_RDX_06;
joined_r0x001550f9:
    if ((element_type *)local_1d8._0_8_ != (element_type *)0x0) {
      operator_delete((void *)local_1d8._0_8_,
                      (long)local_1c8.
                            super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>
                            ._M_impl.super__Vector_impl_data._M_start - local_1d8._0_8_);
      puVar15 = extraout_RAX_03;
      aVar21.content = extraout_RDX_07;
    }
    goto LAB_001556fe;
  default:
    pEVar19 = (Exception *)__cxa_allocate_exception(0x18);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
               "Unknown type: %1%");
    local_1d8._0_8_ = local_1ac;
    local_1d8._8_8_ = boost::io::detail::call_put_head<char,std::char_traits<char>,avro::Type>;
    local_1c8.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)boost::io::detail::call_put_last<char,std::char_traits<char>,avro::Type>;
    pbVar20 = boost::io::detail::
              feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                        ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_150,(put_holder<char,_std::char_traits<char>_> *)local_1d8);
    Exception::Exception(pEVar19,pbVar20);
    __cxa_throw(pEVar19,&Exception::typeinfo,Exception::~Exception);
  }
  *(undefined8 **)(this + 8) = puVar15;
LAB_001556fe:
  GVar27.value_.content = aVar21.content;
  GVar27._0_8_ = puVar15;
  return GVar27;
}

Assistant:

static GenericDatum makeGenericDatum(NodePtr n, const Entity& e,
    const SymbolTable& st)
{
    Type t = n->type();
    if (t == AVRO_SYMBOLIC) {
        n = st.find(n->name())->second;
        t = n->type();
    }
    switch (t) {
    case AVRO_STRING:
        assertType(e, json::etString);
        return GenericDatum(e.stringValue());
    case AVRO_BYTES:
        assertType(e, json::etString);
        return GenericDatum(toBin(e.stringValue()));
    case AVRO_INT:
        assertType(e, json::etLong);
        return GenericDatum(static_cast<int32_t>(e.longValue()));
    case AVRO_LONG:
        assertType(e, json::etLong);
        return GenericDatum(e.longValue());
    case AVRO_FLOAT:
        assertType(e, json::etDouble);
        return GenericDatum(static_cast<float>(e.doubleValue()));
    case AVRO_DOUBLE:
        assertType(e, json::etDouble);
        return GenericDatum(e.doubleValue());
    case AVRO_BOOL:
        assertType(e, json::etBool);
        return GenericDatum(e.boolValue());
    case AVRO_NULL:
        assertType(e, json::etNull);
        return GenericDatum();
    case AVRO_RECORD:
    {
        assertType(e, json::etObject);
        GenericRecord result(n);
        const map<string, Entity>& v = e.objectValue();
        for (size_t i = 0; i < n->leaves(); ++i) {
            map<string, Entity>::const_iterator it = v.find(n->nameAt(i));
            if (it == v.end()) {
                throw Exception(boost::format(
                    "No value found in default for %1%") % n->nameAt(i));
            }
            result.setFieldAt(i,
                makeGenericDatum(n->leafAt(i), it->second, st));
        }
        return GenericDatum(n, result);
    }
    case AVRO_ENUM:
        assertType(e, json::etString);
        return GenericDatum(n, GenericEnum(n, e.stringValue()));
    case AVRO_ARRAY:
    {
        assertType(e, json::etArray);
        GenericArray result(n);
        const vector<Entity>& elements = e.arrayValue();
        for (vector<Entity>::const_iterator it = elements.begin();
            it != elements.end(); ++it) {
            result.value().push_back(makeGenericDatum(n->leafAt(0), *it, st));
        }
        return GenericDatum(n, result);
    }
    case AVRO_MAP:
    {
        assertType(e, json::etObject);
        GenericMap result(n);
        const map<string, Entity>& v = e.objectValue();
        for (map<string, Entity>::const_iterator it = v.begin();
            it != v.end(); ++it) {
            result.value().push_back(make_pair(it->first,
                makeGenericDatum(n->leafAt(1), it->second, st)));
        }
        return GenericDatum(n, result);
    }
    case AVRO_UNION:
    {
        GenericUnion result(n);
        string name;
        Entity e2;
        if (e.type() == json::etNull) {
            name = "null";
            e2 = e;
        } else {
            assertType(e, json::etObject);
            const map<string, Entity>& v = e.objectValue();
            if (v.size() != 1) {
                throw Exception(boost::format("Default value for "
                    "union has more than one field: %1%") % e.toString());
            }
            map<string, Entity>::const_iterator it = v.begin();
            name = it->first;
            e2 = it->second;
        }
        for (size_t i = 0; i < n->leaves(); ++i) {
            const NodePtr& b = n->leafAt(i);
            if (nameof(b) == name) {
                result.selectBranch(i);
                result.datum() = makeGenericDatum(b, e2, st);
                return GenericDatum(n, result);
            }
        }
        throw Exception(boost::format("Invalid default value %1%") %
            e.toString());
    }
    case AVRO_FIXED:
        assertType(e, json::etString);
        return GenericDatum(n, GenericFixed(n, toBin(e.stringValue())));
    default:
        throw Exception(boost::format("Unknown type: %1%") % t);
    }
    return GenericDatum();
}